

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t generic_unpack_deep(exr_decode_pipeline_t *decode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint16_t uVar7;
  int iVar8;
  float fVar9;
  uint32_t ui;
  long lVar10;
  long in_RDI;
  bool bVar11;
  int s_8;
  uint32_t *src_8;
  uint32_t fint_3;
  int s_7;
  uint32_t *src_7;
  uint32_t fint_2;
  int s_6;
  uint32_t *src_6;
  uint32_t fint_1;
  int s_5;
  uint32_t *src_5;
  int s_4;
  uint32_t *src_4;
  uint32_t fint;
  int s_3;
  uint32_t *src_3;
  uint16_t cval_1;
  int s_2;
  uint16_t *src_2;
  uint16_t cval;
  int s_1;
  uint16_t *src_1;
  int s;
  uint16_t *src;
  int32_t tmp;
  int32_t samps;
  int x_1;
  int x;
  int incr_tot;
  int32_t prevsamps;
  exr_coding_channel_info_t *decc;
  int c;
  int y;
  size_t totsamps;
  int uls;
  int ubpc;
  int bpc;
  int h;
  int w;
  uint8_t *cdata;
  int32_t *sampbuffer;
  uint8_t *srcbuffer;
  uint in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  int local_fc;
  int local_ec;
  int local_dc;
  int local_cc;
  int local_bc;
  int local_ac;
  int local_9c;
  int local_8c;
  int local_7c;
  int local_6c;
  int local_68;
  int local_64;
  int local_5c;
  int local_50;
  int local_4c;
  long local_48;
  float *local_28;
  long local_20;
  
  local_20 = *(long *)(in_RDI + 0xa8);
  local_48 = 0;
  iVar2 = *(int *)(in_RDI + 0x30);
  iVar3 = *(int *)(in_RDI + 0x2c);
  iVar4 = *(int *)(in_RDI + 100);
  iVar5 = *(int *)(in_RDI + 0x60);
  local_4c = 0;
  do {
    if (iVar3 - iVar4 <= local_4c) {
      return 0;
    }
    for (local_50 = 0; local_50 < *(short *)(in_RDI + 0x10); local_50 = local_50 + 1) {
      lVar10 = *(long *)(in_RDI + 8) + (long)local_50 * 0x30;
      local_5c = 0;
      bVar11 = false;
      if (iVar5 <= local_4c) {
        bVar11 = local_50 + 1 == (int)*(short *)(in_RDI + 0x10);
      }
      iVar8 = (int)*(short *)(lVar10 + 0x1c);
      if (*(long *)(lVar10 + 0x28) == 0) {
        local_5c = 0;
        if ((*(ushort *)(in_RDI + 0x12) & 1) == 0) {
          local_5c = *(int *)(local_20 + (long)(iVar2 + -1) * 4);
        }
        else {
          for (local_64 = 0; local_64 < iVar2; local_64 = local_64 + 1) {
            local_5c = *(int *)(local_20 + (long)local_64 * 4) + local_5c;
          }
        }
        if (bVar11) {
          local_48 = local_5c + local_48;
        }
      }
      else {
        local_28 = (float *)(local_48 * iVar8 + *(long *)(lVar10 + 0x28));
        for (local_68 = 0; local_68 < iVar2; local_68 = local_68 + 1) {
          iVar6 = *(int *)(local_20 + (long)local_68 * 4);
          local_6c = iVar6;
          if ((*(ushort *)(in_RDI + 0x12) & 1) == 0) {
            local_6c = iVar6 - local_5c;
            local_5c = iVar6;
          }
          sVar1 = *(short *)(lVar10 + 0x1a);
          if (sVar1 == 0) {
            in_stack_fffffffffffffef0 = (uint)*(ushort *)(lVar10 + 0x1e);
            if (in_stack_fffffffffffffef0 == 0) {
              for (local_fc = 0; local_fc < local_6c; local_fc = local_fc + 1) {
                fVar9 = (float)unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                                 in_stack_fffffffffffffef0));
                *local_28 = fVar9;
                local_28 = (float *)((long)local_28 + (long)iVar8);
              }
            }
            else if (in_stack_fffffffffffffef0 == 1) {
              for (local_dc = 0; local_dc < local_6c; local_dc = local_dc + 1) {
                unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0));
                uVar7 = uint_to_half(0x22bf4e);
                *(uint16_t *)local_28 = uVar7;
                local_28 = (float *)((long)local_28 + (long)iVar8);
              }
            }
            else {
              if (in_stack_fffffffffffffef0 != 2) {
                return 3;
              }
              for (local_ec = 0; local_ec < local_6c; local_ec = local_ec + 1) {
                ui = unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                       in_stack_fffffffffffffef0));
                fVar9 = uint_to_float(ui);
                *local_28 = fVar9;
                local_28 = (float *)((long)local_28 + (long)iVar8);
              }
            }
          }
          else if (sVar1 == 1) {
            sVar1 = *(short *)(lVar10 + 0x1e);
            if (sVar1 == 0) {
              for (local_9c = 0; local_9c < local_6c; local_9c = local_9c + 1) {
                unaligned_load16((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0));
                fVar9 = (float)half_to_uint(0x22);
                *local_28 = fVar9;
                local_28 = (float *)((long)local_28 + (long)iVar8);
              }
            }
            else if (sVar1 == 1) {
              for (local_7c = 0; local_7c < local_6c; local_7c = local_7c + 1) {
                uVar7 = unaligned_load16((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                          in_stack_fffffffffffffef0));
                *(uint16_t *)local_28 = uVar7;
                local_28 = (float *)((long)local_28 + (long)iVar8);
              }
            }
            else {
              if (sVar1 != 2) {
                return 3;
              }
              for (local_8c = 0; local_8c < local_6c; local_8c = local_8c + 1) {
                unaligned_load16((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0));
                fVar9 = half_to_float(0);
                *local_28 = fVar9;
                local_28 = (float *)((long)local_28 + (long)iVar8);
              }
            }
          }
          else {
            if (sVar1 != 2) {
              return 3;
            }
            in_stack_fffffffffffffef4 = (uint)*(ushort *)(lVar10 + 0x1e);
            if (in_stack_fffffffffffffef4 == 0) {
              for (local_cc = 0; local_cc < local_6c; local_cc = local_cc + 1) {
                unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0));
                fVar9 = (float)float_to_uint_int(0);
                *local_28 = fVar9;
                local_28 = (float *)((long)local_28 + (long)iVar8);
              }
            }
            else if (in_stack_fffffffffffffef4 == 1) {
              for (local_ac = 0; local_ac < local_6c; local_ac = local_ac + 1) {
                unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0));
                uVar7 = float_to_half_int(0);
                *(uint16_t *)local_28 = uVar7;
                local_28 = (float *)((long)local_28 + (long)iVar8);
              }
            }
            else {
              if (in_stack_fffffffffffffef4 != 2) {
                return 3;
              }
              for (local_bc = 0; local_bc < local_6c; local_bc = local_bc + 1) {
                fVar9 = (float)unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                                 in_stack_fffffffffffffef0));
                *local_28 = fVar9;
                local_28 = (float *)((long)local_28 + (long)iVar8);
              }
            }
          }
          if (bVar11) {
            local_48 = local_6c + local_48;
          }
        }
      }
    }
    local_20 = local_20 + (long)iVar2 * 4;
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack_deep (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc, uls;
    size_t         totsamps = 0;

    w = decode->chunk.width;
    h = decode->chunk.height - decode->user_line_end_ignore;

    /* for user line skip, we use y in the loop so account for that */
    uls = decode->user_line_begin_skip;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;

            int incr_tot = (y >= uls && ((c + 1) == decode->channel_count));

            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            cdata = decc->decode_to_ptr;

            if (!cdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];

                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);

                if (incr_tot) totsamps += (size_t) prevsamps;

                continue;
            }

            cdata += totsamps * ((size_t) ubpc);

            for (int x = 0; x < w; ++x)
            {
                int32_t samps = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                UNPACK_SAMPLES (samps)

                srcbuffer += ((size_t) bpc) * ((size_t) samps);
                if (incr_tot) totsamps += (size_t) samps;
            }
        }
        sampbuffer += w;
    }

    return EXR_ERR_SUCCESS;
}